

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void x25519_ge_add(ge_p1p1 *r,ge_p3 *p,ge_cached *q)

{
  undefined1 local_c0 [8];
  fe trT;
  fe trZ;
  fe trY;
  fe trX;
  ge_cached *q_local;
  ge_p3 *p_local;
  ge_p1p1 *r_local;
  
  fe_add(&r->X,&p->Y,&p->X);
  fe_sub(&r->Y,&p->Y,&p->X);
  fe_mul_tll((fe *)(trT.v + 4),&r->X,&q->YplusX);
  fe_mul_tll((fe *)(trZ.v + 4),&r->Y,&q->YminusX);
  fe_mul_tlt((fe *)local_c0,&q->T2d,&p->T);
  fe_mul_ttl((fe *)(trY.v + 4),&p->Z,&q->Z);
  fe_add(&r->T,(fe *)(trY.v + 4),(fe *)(trY.v + 4));
  fe_sub(&r->X,(fe *)(trT.v + 4),(fe *)(trZ.v + 4));
  fe_add(&r->Y,(fe *)(trT.v + 4),(fe *)(trZ.v + 4));
  fe_carry((fe *)(trT.v + 4),&r->T);
  fe_add(&r->Z,(fe *)(trT.v + 4),(fe *)local_c0);
  fe_sub(&r->T,(fe *)(trT.v + 4),(fe *)local_c0);
  return;
}

Assistant:

void x25519_ge_add(ge_p1p1 *r, const ge_p3 *p, const ge_cached *q) {
  fe trX, trY, trZ, trT;

  fe_add(&r->X, &p->Y, &p->X);
  fe_sub(&r->Y, &p->Y, &p->X);
  fe_mul_tll(&trZ, &r->X, &q->YplusX);
  fe_mul_tll(&trY, &r->Y, &q->YminusX);
  fe_mul_tlt(&trT, &q->T2d, &p->T);
  fe_mul_ttl(&trX, &p->Z, &q->Z);
  fe_add(&r->T, &trX, &trX);
  fe_sub(&r->X, &trZ, &trY);
  fe_add(&r->Y, &trZ, &trY);
  fe_carry(&trZ, &r->T);
  fe_add(&r->Z, &trZ, &trT);
  fe_sub(&r->T, &trZ, &trT);
}